

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.hpp
# Opt level: O0

int __thiscall
qclab::qgates::iSWAP<std::complex<double>_>::toQASM
          (iSWAP<std::complex<double>_> *this,ostream *stream,int offset)

{
  uint uVar1;
  const_reference pvVar2;
  int qubit1;
  __string_type local_40;
  int local_1c;
  ostream *poStack_18;
  int offset_local;
  ostream *stream_local;
  iSWAP<std::complex<double>_> *this_local;
  
  local_1c = offset;
  poStack_18 = stream;
  stream_local = (ostream *)this;
  pvVar2 = std::array<int,_2UL>::operator[](&this->qubits_,0);
  uVar1 = *pvVar2 + local_1c;
  qubit1 = local_1c;
  pvVar2 = std::array<int,_2UL>::operator[](&this->qubits_,1);
  qasmiSWAP_abi_cxx11_(&local_40,(qclab *)(ulong)uVar1,*pvVar2 + local_1c,qubit1);
  std::operator<<(stream,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmiSWAP( qubits_[0] + offset , qubits_[1] + offset ) ;
          return 0 ;
        }